

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.hpp
# Opt level: O3

shared_ptr<helics::CommFactory::CommBuilder>
helics::CommFactory::addCommType<helics::zeromq::ZmqCommsSS>(string_view commTypeName,int code)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Atomic_word *p_Var1;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar2;
  int in_R8D;
  shared_ptr<helics::CommFactory::CommBuilder> sVar3;
  string_view name;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  name._M_len._4_4_ = in_register_00000014;
  name._M_len._0_4_ = code;
  peVar2 = (element_type *)commTypeName._M_len;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004c1f68;
  local_38 = this + 1;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR_build_004c1fb8;
  peVar2->_vptr_CommBuilder = (_func_int **)local_38;
  peVar2[1]._vptr_CommBuilder = (_func_int **)this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
    local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2->_vptr_CommBuilder;
    local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2[1]._vptr_CommBuilder;
    if (local_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00249787;
    p_Var1 = &local_30->_M_use_count;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
      goto LAB_00249787;
    }
  }
  else {
    p_Var1 = &this->_M_use_count;
    this->_M_use_count = 2;
    local_30 = this;
  }
  *p_Var1 = *p_Var1 + 1;
LAB_00249787:
  name._M_str._0_4_ = in_ECX;
  name._M_str._4_4_ = 0;
  defineCommBuilder((CommFactory *)&local_38,
                    (shared_ptr<helics::CommFactory::CommBuilder> *)commTypeName._M_str,name,in_R8D)
  ;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  sVar3.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  return (shared_ptr<helics::CommFactory::CommBuilder>)
         sVar3.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CommBuilder> addCommType(std::string_view commTypeName, int code)
    {
        auto bld = std::make_shared<CommTypeBuilder<CommTYPE>>();
        std::shared_ptr<CommBuilder> cbld = std::static_pointer_cast<CommBuilder>(bld);
        defineCommBuilder(cbld, commTypeName, code);
        return cbld;
    }